

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

bool wallet::RemoveWalletSetting(Chain *chain,string *wallet_name)

{
  byte bVar1;
  allocator<char> *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  anon_class_8_1_e1c75d71 update_function;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  anon_class_8_1_e1c75d71 *in_stack_ffffffffffffff60;
  function<std::optional<interfaces::SettingsAction>_(UniValue_&)> *this;
  long *__s;
  undefined8 in_stack_ffffffffffffffa8;
  allocator<char> local_31 [9];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __s = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffa8,(char *)__s,in_RSI);
  this = (function<std::optional<interfaces::SettingsAction>_(UniValue_&)> *)
         &stack0xffffffffffffffa8;
  std::function<std::optional<interfaces::SettingsAction>(UniValue&)>::
  function<wallet::RemoveWalletSetting(interfaces::Chain&,std::__cxx11::string_const&)::__0_const&,void>
            (this,in_stack_ffffffffffffff60);
  bVar1 = (**(code **)(*in_RDI + 0x188))(in_RDI,local_28,this);
  std::function<std::optional<interfaces::SettingsAction>_(UniValue_&)>::~function
            ((function<std::optional<interfaces::SettingsAction>_(UniValue_&)> *)
             in_stack_ffffffffffffff58);
  std::__cxx11::string::~string(in_stack_ffffffffffffff58);
  std::allocator<char>::~allocator(local_31);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool RemoveWalletSetting(interfaces::Chain& chain, const std::string& wallet_name)
{
    const auto update_function = [&wallet_name](common::SettingsValue& setting_value) {
        if (!setting_value.isArray()) return interfaces::SettingsAction::SKIP_WRITE;
        common::SettingsValue new_value(common::SettingsValue::VARR);
        for (const auto& value : setting_value.getValues()) {
            if (!value.isStr() || value.get_str() != wallet_name) new_value.push_back(value);
        }
        if (new_value.size() == setting_value.size()) return interfaces::SettingsAction::SKIP_WRITE;
        setting_value = std::move(new_value);
        return interfaces::SettingsAction::WRITE;
    };
    return chain.updateRwSetting("wallet", update_function);
}